

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

bool __thiscall Am_Value::operator==(Am_Value *this,char *test_value)

{
  ushort uVar1;
  bool bVar2;
  
  uVar1 = this->type;
  if ((uVar1 < 10) && ((0x20cU >> (uVar1 & 0x1f) & 1) != 0)) {
    return test_value == (char *)0x0 && (this->value).wrapper_value == (Am_Wrapper *)0x0;
  }
  if (uVar1 == 0x8008) {
    bVar2 = Am_String_Data::operator==((Am_String_Data *)(this->value).wrapper_value,test_value);
    return bVar2;
  }
  return false;
}

Assistant:

bool
Am_Value::operator==(const char *test_value) const
{
  switch (type) {
  case Am_STRING:
    return *(Am_String_Data *)value.wrapper_value == test_value;
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return !value.voidptr_value && !test_value;
  default:
    return false;
  }
}